

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_diff_nims(nt_opts *opts)

{
  nifti_image *s0;
  nifti_image *s1;
  uint local_2c;
  int diffs;
  nifti_image *nim1;
  nifti_image *nim0;
  nt_opts *opts_local;
  
  if ((opts->infiles).len == 2) {
    if (2 < g_debug) {
      fprintf(_stderr,"-d nifti_image diff between %s and %s...\n",*(opts->infiles).list,
              (opts->infiles).list[1]);
    }
    s0 = nt_image_read(opts,*(opts->infiles).list,0);
    if (s0 == (nifti_image *)0x0) {
      opts_local._4_4_ = 1;
    }
    else {
      s1 = nt_image_read(opts,(opts->infiles).list[1],0);
      if (s1 == (nifti_image *)0x0) {
        free(s0);
        opts_local._4_4_ = 1;
      }
      else {
        if (1 < g_debug) {
          fprintf(_stderr,"\n-d nifti_image diffs between \'%s\' and \'%s\'...\n",
                  *(opts->infiles).list,(opts->infiles).list[1]);
        }
        if ((opts->flist).len < 1) {
          local_2c = diff_nims(s0,s1,(uint)(0 < g_debug));
        }
        else {
          local_2c = diff_nims_list(s0,s1,&opts->flist,(uint)(0 < g_debug));
        }
        if ((local_2c == 0) && (1 < g_debug)) {
          fprintf(_stderr,"+d no differences found\n");
        }
        else if (2 < g_debug) {
          fprintf(_stderr,"+d %d differences found\n",(ulong)local_2c);
        }
        nifti_image_free(s0);
        nifti_image_free(s1);
        opts_local._4_4_ = (uint)(0 < (int)local_2c);
      }
    }
  }
  else {
    fprintf(_stderr,"** -diff_nim requires 2 -infiles, have %d\n",(ulong)(uint)(opts->infiles).len);
    opts_local._4_4_ = 1;
  }
  return opts_local._4_4_;
}

Assistant:

int act_diff_nims( nt_opts * opts )
{
   nifti_image * nim0, * nim1;
   int           diffs = 0;

   if( opts->infiles.len != 2 ){
      fprintf(stderr,"** -diff_nim requires 2 -infiles, have %d\n",
              opts->infiles.len);
      return 1;
   }

   if( g_debug > 2 )
      fprintf(stderr,"-d nifti_image diff between %s and %s...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   /* get the nifiti images */

   nim0 = nt_image_read(opts, opts->infiles.list[0], 0);
   if( ! nim0 ) return 1;  /* errors have been printed */

   nim1 = nt_image_read(opts, opts->infiles.list[1], 0);
   if( ! nim1 ){ free(nim0); return 1; }

   if( g_debug > 1 )
      fprintf(stderr,"\n-d nifti_image diffs between '%s' and '%s'...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   if( opts->flist.len <= 0 )
      diffs = diff_nims(nim0, nim1, g_debug > 0);
   else
      diffs = diff_nims_list(nim0, nim1, &opts->flist, g_debug > 0);

   if( diffs == 0 && g_debug > 1 )
      fprintf(stderr,"+d no differences found\n");
   else if ( g_debug > 2 )
      fprintf(stderr,"+d %d differences found\n", diffs);

   nifti_image_free(nim0);
   nifti_image_free(nim1);

   return (diffs > 0);
}